

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceDefinition.cpp
# Opt level: O0

bool __thiscall deqp::gles31::Functional::ProgramInterfaceDefinition::Shader::isValid(Shader *this)

{
  int location_;
  FormatLayout FVar1;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  ulong uVar6;
  int local_64;
  int local_60;
  int interfaceNdx_6;
  int varNdx_6;
  int interfaceNdx_5;
  int varNdx_5;
  int interfaceNdx_4;
  int varNdx_4;
  int interfaceNdx_3;
  int varNdx_3;
  int interfaceNdx_2;
  int varNdx_2;
  int interfaceNdx_1;
  int varNdx_1;
  int interfaceNdx;
  Layout layoutWithLocationAndBinding;
  int varNdx;
  Shader *this_local;
  
  layoutWithLocationAndBinding.format = FORMATLAYOUT_RGBA32F;
  unique0x10000f46 = this;
  while( true ) {
    FVar1 = layoutWithLocationAndBinding.format;
    sVar3 = std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::size
                      (&(this->m_defaultBlock).variables);
    if ((int)sVar3 <= (int)FVar1) {
      interfaceNdx_1 = 0;
      while( true ) {
        sVar3 = std::vector<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>::size
                          (&(this->m_defaultBlock).interfaceBlocks);
        if ((int)sVar3 <= interfaceNdx_1) {
          if (this->m_shaderType == SHADERTYPE_VERTEX) {
            for (varNdx_2 = 0;
                sVar3 = std::
                        vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                        ::size(&(this->m_defaultBlock).variables), varNdx_2 < (int)sVar3;
                varNdx_2 = varNdx_2 + 1) {
              pvVar4 = std::
                       vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
                       operator[](&(this->m_defaultBlock).variables,(long)varNdx_2);
              if (pvVar4->storage == STORAGE_IN) {
                pvVar4 = std::
                         vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                         ::operator[](&(this->m_defaultBlock).variables,(long)varNdx_2);
                bVar2 = isIllegalVertexInput(&pvVar4->varType);
                if (bVar2) {
                  return false;
                }
              }
              pvVar4 = std::
                       vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
                       operator[](&(this->m_defaultBlock).variables,(long)varNdx_2);
              if (pvVar4->storage == STORAGE_OUT) {
                pvVar4 = std::
                         vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                         ::operator[](&(this->m_defaultBlock).variables,(long)varNdx_2);
                bVar2 = isIllegalVertexOutput(&pvVar4->varType,false,false);
                if (bVar2) {
                  return false;
                }
              }
              pvVar4 = std::
                       vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
                       operator[](&(this->m_defaultBlock).variables,(long)varNdx_2);
              if ((pvVar4->storage == STORAGE_OUT) &&
                 (pvVar4 = std::
                           vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                           ::operator[](&(this->m_defaultBlock).variables,(long)varNdx_2),
                 pvVar4->interpolation != INTERPOLATION_FLAT)) {
                pvVar4 = std::
                         vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                         ::operator[](&(this->m_defaultBlock).variables,(long)varNdx_2);
                bVar2 = isTypeIntegerOrContainsIntegers(&pvVar4->varType);
                if (bVar2) {
                  return false;
                }
              }
            }
            for (interfaceNdx_2 = 0;
                sVar3 = std::vector<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>::size
                                  (&(this->m_defaultBlock).interfaceBlocks),
                interfaceNdx_2 < (int)sVar3; interfaceNdx_2 = interfaceNdx_2 + 1) {
              pvVar5 = std::vector<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>::
                       operator[](&(this->m_defaultBlock).interfaceBlocks,(long)interfaceNdx_2);
              if (((pvVar5->storage == STORAGE_IN) ||
                  (pvVar5 = std::vector<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>::
                            operator[](&(this->m_defaultBlock).interfaceBlocks,(long)interfaceNdx_2)
                  , pvVar5->storage == STORAGE_PATCH_IN)) ||
                 (pvVar5 = std::vector<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>::
                           operator[](&(this->m_defaultBlock).interfaceBlocks,(long)interfaceNdx_2),
                 pvVar5->storage == STORAGE_PATCH_OUT)) {
                return false;
              }
            }
          }
          else if (this->m_shaderType == SHADERTYPE_FRAGMENT) {
            for (varNdx_3 = 0;
                sVar3 = std::
                        vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                        ::size(&(this->m_defaultBlock).variables), varNdx_3 < (int)sVar3;
                varNdx_3 = varNdx_3 + 1) {
              pvVar4 = std::
                       vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
                       operator[](&(this->m_defaultBlock).variables,(long)varNdx_3);
              if (pvVar4->storage == STORAGE_IN) {
                pvVar4 = std::
                         vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                         ::operator[](&(this->m_defaultBlock).variables,(long)varNdx_3);
                bVar2 = isIllegalFragmentInput(&pvVar4->varType);
                if (bVar2) {
                  return false;
                }
              }
              pvVar4 = std::
                       vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
                       operator[](&(this->m_defaultBlock).variables,(long)varNdx_3);
              if ((pvVar4->storage == STORAGE_IN) &&
                 (pvVar4 = std::
                           vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                           ::operator[](&(this->m_defaultBlock).variables,(long)varNdx_3),
                 pvVar4->interpolation != INTERPOLATION_FLAT)) {
                pvVar4 = std::
                         vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                         ::operator[](&(this->m_defaultBlock).variables,(long)varNdx_3);
                bVar2 = isTypeIntegerOrContainsIntegers(&pvVar4->varType);
                if (bVar2) {
                  return false;
                }
              }
              pvVar4 = std::
                       vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
                       operator[](&(this->m_defaultBlock).variables,(long)varNdx_3);
              if (pvVar4->storage == STORAGE_OUT) {
                pvVar4 = std::
                         vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                         ::operator[](&(this->m_defaultBlock).variables,(long)varNdx_3);
                bVar2 = isIllegalFragmentOutput(&pvVar4->varType,false);
                if (bVar2) {
                  return false;
                }
              }
            }
            for (interfaceNdx_3 = 0;
                sVar3 = std::vector<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>::size
                                  (&(this->m_defaultBlock).interfaceBlocks),
                interfaceNdx_3 < (int)sVar3; interfaceNdx_3 = interfaceNdx_3 + 1) {
              pvVar5 = std::vector<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>::
                       operator[](&(this->m_defaultBlock).interfaceBlocks,(long)interfaceNdx_3);
              if (((pvVar5->storage == STORAGE_PATCH_IN) ||
                  (pvVar5 = std::vector<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>::
                            operator[](&(this->m_defaultBlock).interfaceBlocks,(long)interfaceNdx_3)
                  , pvVar5->storage == STORAGE_OUT)) ||
                 (pvVar5 = std::vector<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>::
                           operator[](&(this->m_defaultBlock).interfaceBlocks,(long)interfaceNdx_3),
                 pvVar5->storage == STORAGE_PATCH_OUT)) {
                return false;
              }
            }
          }
          else if (this->m_shaderType == SHADERTYPE_COMPUTE) {
            for (varNdx_4 = 0;
                sVar3 = std::
                        vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                        ::size(&(this->m_defaultBlock).variables), varNdx_4 < (int)sVar3;
                varNdx_4 = varNdx_4 + 1) {
              pvVar4 = std::
                       vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
                       operator[](&(this->m_defaultBlock).variables,(long)varNdx_4);
              if ((((pvVar4->storage == STORAGE_IN) ||
                   (pvVar4 = std::
                             vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                             ::operator[](&(this->m_defaultBlock).variables,(long)varNdx_4),
                   pvVar4->storage == STORAGE_PATCH_IN)) ||
                  (pvVar4 = std::
                            vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                            ::operator[](&(this->m_defaultBlock).variables,(long)varNdx_4),
                  pvVar4->storage == STORAGE_OUT)) ||
                 (pvVar4 = std::
                           vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                           ::operator[](&(this->m_defaultBlock).variables,(long)varNdx_4),
                 pvVar4->storage == STORAGE_PATCH_OUT)) {
                return false;
              }
            }
            for (interfaceNdx_4 = 0;
                sVar3 = std::vector<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>::size
                                  (&(this->m_defaultBlock).interfaceBlocks),
                interfaceNdx_4 < (int)sVar3; interfaceNdx_4 = interfaceNdx_4 + 1) {
              pvVar5 = std::vector<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>::
                       operator[](&(this->m_defaultBlock).interfaceBlocks,(long)interfaceNdx_4);
              if (((pvVar5->storage == STORAGE_IN) ||
                  (pvVar5 = std::vector<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>::
                            operator[](&(this->m_defaultBlock).interfaceBlocks,(long)interfaceNdx_4)
                  , pvVar5->storage == STORAGE_PATCH_IN)) ||
                 ((pvVar5 = std::vector<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>::
                            operator[](&(this->m_defaultBlock).interfaceBlocks,(long)interfaceNdx_4)
                  , pvVar5->storage == STORAGE_OUT ||
                  (pvVar5 = std::vector<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>::
                            operator[](&(this->m_defaultBlock).interfaceBlocks,(long)interfaceNdx_4)
                  , pvVar5->storage == STORAGE_PATCH_OUT)))) {
                return false;
              }
            }
          }
          else if (this->m_shaderType == SHADERTYPE_GEOMETRY) {
            for (varNdx_5 = 0;
                sVar3 = std::
                        vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                        ::size(&(this->m_defaultBlock).variables), varNdx_5 < (int)sVar3;
                varNdx_5 = varNdx_5 + 1) {
              pvVar4 = std::
                       vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
                       operator[](&(this->m_defaultBlock).variables,(long)varNdx_5);
              if ((pvVar4->storage == STORAGE_PATCH_IN) ||
                 (pvVar4 = std::
                           vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                           ::operator[](&(this->m_defaultBlock).variables,(long)varNdx_5),
                 pvVar4->storage == STORAGE_PATCH_OUT)) {
                return false;
              }
              pvVar4 = std::
                       vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
                       operator[](&(this->m_defaultBlock).variables,(long)varNdx_5);
              if (pvVar4->storage == STORAGE_IN) {
                pvVar4 = std::
                         vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                         ::operator[](&(this->m_defaultBlock).variables,(long)varNdx_5);
                bVar2 = glu::VarType::isArrayType(&pvVar4->varType);
                if (!bVar2) {
                  return false;
                }
              }
            }
            for (interfaceNdx_5 = 0;
                sVar3 = std::vector<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>::size
                                  (&(this->m_defaultBlock).interfaceBlocks),
                interfaceNdx_5 < (int)sVar3; interfaceNdx_5 = interfaceNdx_5 + 1) {
              pvVar5 = std::vector<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>::
                       operator[](&(this->m_defaultBlock).interfaceBlocks,(long)interfaceNdx_5);
              if ((pvVar5->storage == STORAGE_PATCH_IN) ||
                 (pvVar5 = std::vector<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>::
                           operator[](&(this->m_defaultBlock).interfaceBlocks,(long)interfaceNdx_5),
                 pvVar5->storage == STORAGE_PATCH_OUT)) {
                return false;
              }
              pvVar5 = std::vector<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>::
                       operator[](&(this->m_defaultBlock).interfaceBlocks,(long)interfaceNdx_5);
              if (pvVar5->storage == STORAGE_IN) {
                pvVar5 = std::vector<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>::
                         operator[](&(this->m_defaultBlock).interfaceBlocks,(long)interfaceNdx_5);
                bVar2 = std::vector<int,_std::allocator<int>_>::empty(&pvVar5->dimensions);
                if (bVar2) {
                  return false;
                }
              }
            }
          }
          else if (this->m_shaderType == SHADERTYPE_TESSELLATION_CONTROL) {
            for (varNdx_6 = 0;
                sVar3 = std::
                        vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                        ::size(&(this->m_defaultBlock).variables), varNdx_6 < (int)sVar3;
                varNdx_6 = varNdx_6 + 1) {
              pvVar4 = std::
                       vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
                       operator[](&(this->m_defaultBlock).variables,(long)varNdx_6);
              if (pvVar4->storage == STORAGE_PATCH_IN) {
                return false;
              }
              pvVar4 = std::
                       vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
                       operator[](&(this->m_defaultBlock).variables,(long)varNdx_6);
              if (pvVar4->storage == STORAGE_IN) {
                pvVar4 = std::
                         vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                         ::operator[](&(this->m_defaultBlock).variables,(long)varNdx_6);
                bVar2 = glu::VarType::isArrayType(&pvVar4->varType);
                if (!bVar2) {
                  return false;
                }
              }
              pvVar4 = std::
                       vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
                       operator[](&(this->m_defaultBlock).variables,(long)varNdx_6);
              if (pvVar4->storage == STORAGE_OUT) {
                pvVar4 = std::
                         vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                         ::operator[](&(this->m_defaultBlock).variables,(long)varNdx_6);
                bVar2 = glu::VarType::isArrayType(&pvVar4->varType);
                if (!bVar2) {
                  return false;
                }
              }
            }
            for (interfaceNdx_6 = 0;
                sVar3 = std::vector<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>::size
                                  (&(this->m_defaultBlock).interfaceBlocks),
                interfaceNdx_6 < (int)sVar3; interfaceNdx_6 = interfaceNdx_6 + 1) {
              pvVar5 = std::vector<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>::
                       operator[](&(this->m_defaultBlock).interfaceBlocks,(long)interfaceNdx_6);
              if (pvVar5->storage == STORAGE_PATCH_IN) {
                return false;
              }
              pvVar5 = std::vector<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>::
                       operator[](&(this->m_defaultBlock).interfaceBlocks,(long)interfaceNdx_6);
              if (pvVar5->storage == STORAGE_IN) {
                pvVar5 = std::vector<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>::
                         operator[](&(this->m_defaultBlock).interfaceBlocks,(long)interfaceNdx_6);
                bVar2 = std::vector<int,_std::allocator<int>_>::empty(&pvVar5->dimensions);
                if (bVar2) {
                  return false;
                }
              }
              pvVar5 = std::vector<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>::
                       operator[](&(this->m_defaultBlock).interfaceBlocks,(long)interfaceNdx_6);
              if (pvVar5->storage == STORAGE_OUT) {
                pvVar5 = std::vector<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>::
                         operator[](&(this->m_defaultBlock).interfaceBlocks,(long)interfaceNdx_6);
                bVar2 = std::vector<int,_std::allocator<int>_>::empty(&pvVar5->dimensions);
                if (bVar2) {
                  return false;
                }
              }
            }
          }
          else if (this->m_shaderType == SHADERTYPE_TESSELLATION_EVALUATION) {
            for (local_60 = 0;
                sVar3 = std::
                        vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                        ::size(&(this->m_defaultBlock).variables), local_60 < (int)sVar3;
                local_60 = local_60 + 1) {
              pvVar4 = std::
                       vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
                       operator[](&(this->m_defaultBlock).variables,(long)local_60);
              if (pvVar4->storage == STORAGE_PATCH_OUT) {
                return false;
              }
              pvVar4 = std::
                       vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
                       operator[](&(this->m_defaultBlock).variables,(long)local_60);
              if (pvVar4->storage == STORAGE_IN) {
                pvVar4 = std::
                         vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                         ::operator[](&(this->m_defaultBlock).variables,(long)local_60);
                bVar2 = glu::VarType::isArrayType(&pvVar4->varType);
                if (!bVar2) {
                  return false;
                }
              }
            }
            for (local_64 = 0;
                sVar3 = std::vector<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>::size
                                  (&(this->m_defaultBlock).interfaceBlocks), local_64 < (int)sVar3;
                local_64 = local_64 + 1) {
              pvVar5 = std::vector<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>::
                       operator[](&(this->m_defaultBlock).interfaceBlocks,(long)local_64);
              if (pvVar5->storage == STORAGE_PATCH_OUT) {
                return false;
              }
              pvVar5 = std::vector<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>::
                       operator[](&(this->m_defaultBlock).interfaceBlocks,(long)local_64);
              if (pvVar5->storage == STORAGE_IN) {
                pvVar5 = std::vector<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>::
                         operator[](&(this->m_defaultBlock).interfaceBlocks,(long)local_64);
                bVar2 = std::vector<int,_std::allocator<int>_>::empty(&pvVar5->dimensions);
                if (bVar2) {
                  return false;
                }
              }
            }
          }
          return true;
        }
        pvVar5 = std::vector<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>::operator[]
                           (&(this->m_defaultBlock).interfaceBlocks,(long)interfaceNdx_1);
        sVar3 = std::vector<int,_std::allocator<int>_>::size(&pvVar5->dimensions);
        if (1 < sVar3) {
          return false;
        }
        pvVar5 = std::vector<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>::operator[]
                           (&(this->m_defaultBlock).interfaceBlocks,(long)interfaceNdx_1);
        bVar2 = std::vector<int,_std::allocator<int>_>::empty(&pvVar5->dimensions);
        if (!bVar2) {
          std::vector<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>::operator[]
                    (&(this->m_defaultBlock).interfaceBlocks,(long)interfaceNdx_1);
          uVar6 = std::__cxx11::string::empty();
          if ((uVar6 & 1) != 0) {
            return false;
          }
        }
        pvVar5 = std::vector<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>::operator[]
                           (&(this->m_defaultBlock).interfaceBlocks,(long)interfaceNdx_1);
        bVar2 = ProgramInterfaceDefinition::anon_unknown_0::containsMatchingSubtype
                          (&pvVar5->variables,
                           ProgramInterfaceDefinition::anon_unknown_0::isOpaqueType);
        if (bVar2) break;
        interfaceNdx_1 = interfaceNdx_1 + 1;
      }
      return false;
    }
    pvVar4 = std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
             operator[](&(this->m_defaultBlock).variables,
                        (long)(int)layoutWithLocationAndBinding.format);
    if ((pvVar4->layout).binding == -1) {
      pvVar4 = std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
               operator[](&(this->m_defaultBlock).variables,
                          (long)(int)layoutWithLocationAndBinding.format);
      bVar2 = ProgramInterfaceDefinition::anon_unknown_0::containsMatchingSubtype
                        (&pvVar4->varType,glu::isDataTypeAtomicCounter);
      if (bVar2) {
        return false;
      }
    }
    pvVar4 = std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
             operator[](&(this->m_defaultBlock).variables,
                        (long)(int)layoutWithLocationAndBinding.format);
    bVar2 = glu::VarType::isStructType(&pvVar4->varType);
    if (bVar2) {
      pvVar4 = std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
               operator[](&(this->m_defaultBlock).variables,
                          (long)(int)layoutWithLocationAndBinding.format);
      bVar2 = ProgramInterfaceDefinition::anon_unknown_0::containsMatchingSubtype
                        (&pvVar4->varType,glu::isDataTypeAtomicCounter);
      if (bVar2) {
        return false;
      }
    }
    pvVar4 = std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
             operator[](&(this->m_defaultBlock).variables,
                        (long)(int)layoutWithLocationAndBinding.format);
    if ((pvVar4->layout).matrixOrder != MATRIXORDER_LAST) break;
    pvVar4 = std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
             operator[](&(this->m_defaultBlock).variables,
                        (long)(int)layoutWithLocationAndBinding.format);
    bVar2 = ProgramInterfaceDefinition::anon_unknown_0::containsMatchingSubtype
                      (&pvVar4->varType,glu::isDataTypeSampler);
    if (bVar2) {
      pvVar4 = std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
               operator[](&(this->m_defaultBlock).variables,
                          (long)(int)layoutWithLocationAndBinding.format);
      location_ = (pvVar4->layout).location;
      pvVar4 = std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
               operator[](&(this->m_defaultBlock).variables,
                          (long)(int)layoutWithLocationAndBinding.format);
      glu::Layout::Layout((Layout *)&varNdx_1,location_,(pvVar4->layout).binding,-1,
                          FORMATLAYOUT_LAST,MATRIXORDER_LAST);
      pvVar4 = std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
               operator[](&(this->m_defaultBlock).variables,
                          (long)(int)layoutWithLocationAndBinding.format);
      bVar2 = glu::Layout::operator!=(&pvVar4->layout,(Layout *)&varNdx_1);
      if (bVar2) {
        return false;
      }
    }
    layoutWithLocationAndBinding.format = layoutWithLocationAndBinding.format + FORMATLAYOUT_RGBA16F
    ;
  }
  return false;
}

Assistant:

bool Shader::isValid (void) const
{
	// Default block variables
	{
		for (int varNdx = 0; varNdx < (int)m_defaultBlock.variables.size(); ++varNdx)
		{
			// atomic declaration in the default block without binding
			if (m_defaultBlock.variables[varNdx].layout.binding == -1 &&
				containsMatchingSubtype(m_defaultBlock.variables[varNdx].varType, glu::isDataTypeAtomicCounter))
				return false;

			// atomic declaration in a struct
			if (m_defaultBlock.variables[varNdx].varType.isStructType() &&
				containsMatchingSubtype(m_defaultBlock.variables[varNdx].varType, glu::isDataTypeAtomicCounter))
				return false;

			// Unsupported layout qualifiers

			if (m_defaultBlock.variables[varNdx].layout.matrixOrder != glu::MATRIXORDER_LAST)
				return false;

			if (containsMatchingSubtype(m_defaultBlock.variables[varNdx].varType, glu::isDataTypeSampler))
			{
				const glu::Layout layoutWithLocationAndBinding(m_defaultBlock.variables[varNdx].layout.location, m_defaultBlock.variables[varNdx].layout.binding);

				if (m_defaultBlock.variables[varNdx].layout != layoutWithLocationAndBinding)
					return false;
			}
		}
	}

	// Interface blocks
	{
		for (int interfaceNdx = 0; interfaceNdx < (int)m_defaultBlock.interfaceBlocks.size(); ++interfaceNdx)
		{
			// ES31 disallows interface block array arrays
			if (m_defaultBlock.interfaceBlocks[interfaceNdx].dimensions.size() > 1)
				return false;

			// Interface block arrays must have instance name
			if (!m_defaultBlock.interfaceBlocks[interfaceNdx].dimensions.empty() && m_defaultBlock.interfaceBlocks[interfaceNdx].instanceName.empty())
				return false;

			// Opaque types in interface block
			if (containsMatchingSubtype(m_defaultBlock.interfaceBlocks[interfaceNdx].variables, isOpaqueType))
				return false;
		}
	}

	// Shader type specific

	if (m_shaderType == glu::SHADERTYPE_VERTEX)
	{
		for (int varNdx = 0; varNdx < (int)m_defaultBlock.variables.size(); ++varNdx)
		{
			if (m_defaultBlock.variables[varNdx].storage == glu::STORAGE_IN && isIllegalVertexInput(m_defaultBlock.variables[varNdx].varType))
				return false;
			if (m_defaultBlock.variables[varNdx].storage == glu::STORAGE_OUT && isIllegalVertexOutput(m_defaultBlock.variables[varNdx].varType))
				return false;
			if (m_defaultBlock.variables[varNdx].storage == glu::STORAGE_OUT && m_defaultBlock.variables[varNdx].interpolation != glu::INTERPOLATION_FLAT && isTypeIntegerOrContainsIntegers(m_defaultBlock.variables[varNdx].varType))
				return false;
		}
		for (int interfaceNdx = 0; interfaceNdx < (int)m_defaultBlock.interfaceBlocks.size(); ++interfaceNdx)
		{
			if (m_defaultBlock.interfaceBlocks[interfaceNdx].storage == glu::STORAGE_IN			||
				m_defaultBlock.interfaceBlocks[interfaceNdx].storage == glu::STORAGE_PATCH_IN	||
				m_defaultBlock.interfaceBlocks[interfaceNdx].storage == glu::STORAGE_PATCH_OUT)
			{
				return false;
			}
		}
	}
	else if (m_shaderType == glu::SHADERTYPE_FRAGMENT)
	{
		for (int varNdx = 0; varNdx < (int)m_defaultBlock.variables.size(); ++varNdx)
		{
			if (m_defaultBlock.variables[varNdx].storage == glu::STORAGE_IN && isIllegalFragmentInput(m_defaultBlock.variables[varNdx].varType))
				return false;
			if (m_defaultBlock.variables[varNdx].storage == glu::STORAGE_IN && m_defaultBlock.variables[varNdx].interpolation != glu::INTERPOLATION_FLAT && isTypeIntegerOrContainsIntegers(m_defaultBlock.variables[varNdx].varType))
				return false;
			if (m_defaultBlock.variables[varNdx].storage == glu::STORAGE_OUT && isIllegalFragmentOutput(m_defaultBlock.variables[varNdx].varType))
				return false;
		}
		for (int interfaceNdx = 0; interfaceNdx < (int)m_defaultBlock.interfaceBlocks.size(); ++interfaceNdx)
		{
			if (m_defaultBlock.interfaceBlocks[interfaceNdx].storage == glu::STORAGE_PATCH_IN	||
				m_defaultBlock.interfaceBlocks[interfaceNdx].storage == glu::STORAGE_OUT		||
				m_defaultBlock.interfaceBlocks[interfaceNdx].storage == glu::STORAGE_PATCH_OUT)
			{
				return false;
			}
		}
	}
	else if (m_shaderType == glu::SHADERTYPE_COMPUTE)
	{
		for (int varNdx = 0; varNdx < (int)m_defaultBlock.variables.size(); ++varNdx)
		{
			if (m_defaultBlock.variables[varNdx].storage == glu::STORAGE_IN			||
				m_defaultBlock.variables[varNdx].storage == glu::STORAGE_PATCH_IN	||
				m_defaultBlock.variables[varNdx].storage == glu::STORAGE_OUT		||
				m_defaultBlock.variables[varNdx].storage == glu::STORAGE_PATCH_OUT)
			{
				return false;
			}
		}
		for (int interfaceNdx = 0; interfaceNdx < (int)m_defaultBlock.interfaceBlocks.size(); ++interfaceNdx)
		{
			if (m_defaultBlock.interfaceBlocks[interfaceNdx].storage == glu::STORAGE_IN			||
				m_defaultBlock.interfaceBlocks[interfaceNdx].storage == glu::STORAGE_PATCH_IN	||
				m_defaultBlock.interfaceBlocks[interfaceNdx].storage == glu::STORAGE_OUT		||
				m_defaultBlock.interfaceBlocks[interfaceNdx].storage == glu::STORAGE_PATCH_OUT)
			{
				return false;
			}
		}
	}
	else if (m_shaderType == glu::SHADERTYPE_GEOMETRY)
	{
		for (int varNdx = 0; varNdx < (int)m_defaultBlock.variables.size(); ++varNdx)
		{
			if (m_defaultBlock.variables[varNdx].storage == glu::STORAGE_PATCH_IN	||
				m_defaultBlock.variables[varNdx].storage == glu::STORAGE_PATCH_OUT)
			{
				return false;
			}
			// arrayed input
			if (m_defaultBlock.variables[varNdx].storage == glu::STORAGE_IN && !m_defaultBlock.variables[varNdx].varType.isArrayType())
				return false;
		}
		for (int interfaceNdx = 0; interfaceNdx < (int)m_defaultBlock.interfaceBlocks.size(); ++interfaceNdx)
		{
			if (m_defaultBlock.interfaceBlocks[interfaceNdx].storage == glu::STORAGE_PATCH_IN	||
				m_defaultBlock.interfaceBlocks[interfaceNdx].storage == glu::STORAGE_PATCH_OUT)
			{
				return false;
			}
			// arrayed input
			if (m_defaultBlock.interfaceBlocks[interfaceNdx].storage == glu::STORAGE_IN && m_defaultBlock.interfaceBlocks[interfaceNdx].dimensions.empty())
				return false;
		}
	}
	else if (m_shaderType == glu::SHADERTYPE_TESSELLATION_CONTROL)
	{
		for (int varNdx = 0; varNdx < (int)m_defaultBlock.variables.size(); ++varNdx)
		{
			if (m_defaultBlock.variables[varNdx].storage == glu::STORAGE_PATCH_IN)
				return false;
			// arrayed input
			if (m_defaultBlock.variables[varNdx].storage == glu::STORAGE_IN && !m_defaultBlock.variables[varNdx].varType.isArrayType())
				return false;
			// arrayed output
			if (m_defaultBlock.variables[varNdx].storage == glu::STORAGE_OUT && !m_defaultBlock.variables[varNdx].varType.isArrayType())
				return false;
		}
		for (int interfaceNdx = 0; interfaceNdx < (int)m_defaultBlock.interfaceBlocks.size(); ++interfaceNdx)
		{
			if (m_defaultBlock.interfaceBlocks[interfaceNdx].storage == glu::STORAGE_PATCH_IN)
				return false;
			// arrayed input
			if (m_defaultBlock.interfaceBlocks[interfaceNdx].storage == glu::STORAGE_IN && m_defaultBlock.interfaceBlocks[interfaceNdx].dimensions.empty())
				return false;
			// arrayed output
			if (m_defaultBlock.interfaceBlocks[interfaceNdx].storage == glu::STORAGE_OUT && m_defaultBlock.interfaceBlocks[interfaceNdx].dimensions.empty())
				return false;
		}
	}
	else if (m_shaderType == glu::SHADERTYPE_TESSELLATION_EVALUATION)
	{
		for (int varNdx = 0; varNdx < (int)m_defaultBlock.variables.size(); ++varNdx)
		{
			if (m_defaultBlock.variables[varNdx].storage == glu::STORAGE_PATCH_OUT)
				return false;
			// arrayed input
			if (m_defaultBlock.variables[varNdx].storage == glu::STORAGE_IN && !m_defaultBlock.variables[varNdx].varType.isArrayType())
				return false;
		}
		for (int interfaceNdx = 0; interfaceNdx < (int)m_defaultBlock.interfaceBlocks.size(); ++interfaceNdx)
		{
			if (m_defaultBlock.interfaceBlocks[interfaceNdx].storage == glu::STORAGE_PATCH_OUT)
				return false;
			// arrayed input
			if (m_defaultBlock.interfaceBlocks[interfaceNdx].storage == glu::STORAGE_IN && m_defaultBlock.interfaceBlocks[interfaceNdx].dimensions.empty())
				return false;
		}
	}
	else
		DE_ASSERT(false);

	return true;
}